

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

duckdb_decimal * __thiscall
duckdb::TryCastCInternal<duckdb::hugeint_t,duckdb_decimal,duckdb::TryCast>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,duckdb_result *result,idx_t col,
          idx_t row)

{
  long lVar1;
  bool bVar2;
  hugeint_t input;
  duckdb_decimal result_value;
  duckdb_decimal local_20;
  
  lVar1 = *(long *)(*(long *)(this + 0x18) + (long)result * 0x28);
  input.upper = *(int64_t *)(lVar1 + 8 + col * 0x10);
  input.lower = *(uint64_t *)(lVar1 + col * 0x10);
  bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb_decimal>(input,&local_20,false);
  if (bVar2) {
    (__return_storage_ptr__->value).upper = local_20.value.upper;
    __return_storage_ptr__->width = local_20.width;
    __return_storage_ptr__->scale = local_20.scale;
    *(undefined6 *)&__return_storage_ptr__->field_0x2 = local_20._2_6_;
    (__return_storage_ptr__->value).lower = local_20.value.lower;
  }
  else {
    FetchDefaultValue::Operation<duckdb_decimal>();
  }
  return __return_storage_ptr__;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}